

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

bool __thiscall
llvm::cl::parser<bool>::parse
          (parser<bool> *this,Option *O,StringRef ArgName,StringRef Arg,bool *Value)

{
  raw_ostream *Errs;
  StringRef local_78;
  Twine local_68;
  Twine local_50;
  Twine local_38;
  
  local_78.Length = Arg.Length;
  local_78.Data = Arg.Data;
  switch(local_78.Length) {
  case 0:
    break;
  case 1:
    if ((char)*(int *)local_78.Data != '1') {
      if ((char)*(int *)local_78.Data == '0') goto LAB_0016792c;
      goto switchD_0016785d_caseD_2;
    }
    break;
  case 4:
    if (((*(int *)local_78.Data != 0x65757274) && (*(int *)local_78.Data != 0x45555254)) &&
       (*(int *)local_78.Data != 0x65757254)) goto switchD_0016785d_caseD_2;
    break;
  case 5:
    if ((((char)*(int *)((long)local_78.Data + 4) == 'e' && *(int *)local_78.Data == 0x736c6166) ||
        ((char)*(int *)((long)local_78.Data + 4) == 'E' && *(int *)local_78.Data == 0x534c4146)) ||
       ((char)*(int *)((long)local_78.Data + 4) == 'e' && *(int *)local_78.Data == 0x736c6146)) {
LAB_0016792c:
      *Value = false;
      return false;
    }
  default:
switchD_0016785d_caseD_2:
    Twine::Twine(&local_50,"\'",&local_78);
    Twine::Twine(&local_68,"\' is invalid value for boolean argument! Try 0 or 1");
    operator+(&local_38,&local_50,&local_68);
    Errs = errs();
    Option::error(O,&local_38,(StringRef)ZEXT816(0),Errs);
    return true;
  }
  *Value = true;
  return false;
}

Assistant:

bool parser<bool>::parse(Option &O, StringRef ArgName, StringRef Arg,
                         bool &Value) {
  if (Arg == "" || Arg == "true" || Arg == "TRUE" || Arg == "True" ||
      Arg == "1") {
    Value = true;
    return false;
  }

  if (Arg == "false" || Arg == "FALSE" || Arg == "False" || Arg == "0") {
    Value = false;
    return false;
  }
  return O.error("'" + Arg +
                 "' is invalid value for boolean argument! Try 0 or 1");
}